

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *c;
  ulong uVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  int lenght;
  ulong *c_00;
  int lenght_00;
  ulong *c_01;
  string<unsigned_long> s;
  SAttribute attr;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P;
  puVar4 = c;
  while ((uVar2 = *puVar4, 0x3e < uVar2 || ((0x4000000100002600U >> (uVar2 & 0x3f) & 1) == 0))) {
    puVar4 = puVar4 + 1;
    this->P = puVar4;
  }
  c_01 = puVar4;
  do {
    if (uVar2 < 0x3f) {
      if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0x2f) {
          this->P = c_01 + 1;
          this->IsEmptyElement = true;
LAB_00587c40:
          if ((c < puVar4) && (puVar4[-1] == 0x2f)) {
            puVar4 = puVar4 + -1;
            this->IsEmptyElement = true;
          }
          core::string<unsigned_long>::string<unsigned_long>
                    (&attr.Name,c,(s32)((ulong)((long)puVar4 - (long)c) >> 3));
          core::string<unsigned_long>::operator=(&this->NodeName,&attr.Name);
          core::string<unsigned_long>::~string(&attr.Name);
          this->P = this->P + 1;
          return;
        }
        if (uVar2 == 0x3e) goto LAB_00587c40;
        goto LAB_00587b16;
      }
      c_01 = c_01 + 1;
      this->P = c_01;
    }
    else {
LAB_00587b16:
      lenght = 0;
      c_00 = c_01;
      while ((c_00 = c_00 + 1, 0x3d < uVar2 || ((0x2000000100002600U >> (uVar2 & 0x3f) & 1) == 0)))
      {
        this->P = c_00;
        lenght = lenght + 1;
        uVar2 = *c_00;
      }
      do {
        this->P = c_00;
        uVar2 = *c_00;
        if (uVar2 == 0) {
          return;
        }
        c_00 = c_00 + 1;
      } while ((uVar2 != 0x27) && (uVar2 != 0x22));
      lenght_00 = -1;
      puVar3 = c_00;
      do {
        this->P = puVar3;
        uVar1 = *puVar3;
        puVar3 = puVar3 + 1;
        lenght_00 = lenght_00 + 1;
        if (uVar1 == uVar2) break;
      } while (uVar1 != 0);
      if (uVar1 == 0) {
        return;
      }
      this->P = puVar3;
      SAttribute::SAttribute(&attr);
      core::string<unsigned_long>::string<unsigned_long>(&s,c_01,lenght);
      core::string<unsigned_long>::operator=(&attr.Name,&s);
      core::string<unsigned_long>::~string(&s);
      core::string<unsigned_long>::string<unsigned_long>(&s,c_00,lenght_00);
      replaceSpecialCharacters
                ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)&stack0xffffffffffffffc0,
                 (string<unsigned_long> *)this);
      core::string<unsigned_long>::operator=
                (&attr.Value,(string<unsigned_long> *)&stack0xffffffffffffffc0);
      core::string<unsigned_long>::~string((string<unsigned_long> *)&stack0xffffffffffffffc0);
      core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::push_back
                (&this->Attributes,&attr);
      core::string<unsigned_long>::~string(&s);
      SAttribute::~SAttribute(&attr);
      c_01 = this->P;
    }
    uVar2 = *c_01;
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}